

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::Dynamic_Object_Function
          (Dynamic_Object_Function *this,string *t_type_name,Proxy_Function *t_func,Type_Info *t_ti,
          bool t_is_attribute)

{
  undefined4 uVar1;
  bool bVar2;
  element_type *peVar3;
  Type_Info *in_RCX;
  string *in_RSI;
  Proxy_Function_Base *in_RDI;
  byte in_R8B;
  pointer in_stack_ffffffffffffff68;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *in_stack_ffffffffffffff70;
  pointer this_00;
  Type_Info *in_stack_ffffffffffffff80;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffff88;
  
  peVar3 = std::
           __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2649dc);
  Proxy_Function_Base::get_param_types(peVar3);
  build_param_types(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  peVar3 = std::
           __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x264a03);
  Proxy_Function_Base::get_arity(peVar3);
  Proxy_Function_Base::Proxy_Function_Base
            (in_RDI,in_stack_ffffffffffffff88,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
             in_stack_ffffffffffffff80);
  in_RDI->_vptr_Proxy_Function_Base = (_func_int **)&PTR__Dynamic_Object_Function_005bfd88;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::shared_ptr
            (in_stack_ffffffffffffff70,
             (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)in_stack_ffffffffffffff68);
  bVar2 = Type_Info::is_undef(in_RCX);
  if (bVar2) {
    this_00 = (pointer)0x0;
  }
  else {
    in_stack_ffffffffffffff68 = (pointer)operator_new(0x18);
    in_stack_ffffffffffffff68->m_type_info = in_RCX->m_type_info;
    in_stack_ffffffffffffff68->m_bare_type_info = in_RCX->m_bare_type_info;
    uVar1 = *(undefined4 *)&in_RCX->field_0x14;
    in_stack_ffffffffffffff68->m_flags = in_RCX->m_flags;
    *(undefined4 *)&in_stack_ffffffffffffff68->field_0x14 = uVar1;
    this_00 = in_stack_ffffffffffffff68;
  }
  std::unique_ptr<chaiscript::Type_Info,std::default_delete<chaiscript::Type_Info>>::
  unique_ptr<std::default_delete<chaiscript::Type_Info>,void>
            ((unique_ptr<chaiscript::Type_Info,_std::default_delete<chaiscript::Type_Info>_> *)
             this_00,in_stack_ffffffffffffff68);
  user_type<chaiscript::dispatch::Dynamic_Object>();
  *(byte *)&in_RDI[3]._vptr_Proxy_Function_Base = in_R8B & 1;
  return;
}

Assistant:

Dynamic_Object_Function(
              std::string t_type_name,
              const Proxy_Function &t_func,
              const Type_Info &t_ti,
              bool t_is_attribute = false)
            : Proxy_Function_Base(build_param_types(t_func->get_param_types(), t_ti), t_func->get_arity()),
              m_type_name(std::move(t_type_name)), m_func(t_func), m_ti(t_ti.is_undef()?nullptr:new Type_Info(t_ti)), m_doti(user_type<Dynamic_Object>()),
              m_is_attribute(t_is_attribute)
          {
            assert( (t_func->get_arity() > 0 || t_func->get_arity() < 0)
                && "Programming error, Dynamic_Object_Function must have at least one parameter (this)");
          }